

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_2dcf93::MemberExpr::printLeft(MemberExpr *this,OutputStream *S)

{
  Node *pNVar1;
  char *__src;
  size_t N;
  
  pNVar1 = this->LHS;
  (*pNVar1->_vptr_Node[4])(pNVar1);
  if (pNVar1->RHSComponentCache != No) {
    (*pNVar1->_vptr_Node[5])(pNVar1,S);
  }
  __src = (this->Kind).First;
  N = (long)(this->Kind).Last - (long)__src;
  if (N != 0) {
    OutputStream::grow(S,N);
    memmove(S->Buffer + S->CurrentPosition,__src,N);
    S->CurrentPosition = S->CurrentPosition + N;
  }
  pNVar1 = this->RHS;
  (*pNVar1->_vptr_Node[4])(pNVar1,S);
  if (pNVar1->RHSComponentCache == No) {
    return;
  }
  (*pNVar1->_vptr_Node[5])(pNVar1,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    LHS->print(S);
    S += Kind;
    RHS->print(S);
  }